

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O3

uptr_t __thiscall
lsim::gui::CircuitEditorFactory::create_circuit(CircuitEditorFactory *this,ModelCircuit *circuit)

{
  CircuitEditor *this_00;
  ModelComponent *component_model;
  pointer *__ptr;
  uint *comp_id;
  uint32_t *puVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> comp_ids;
  CircuitEditor *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  this_00 = (CircuitEditor *)operator_new(0x148);
  CircuitEditor::CircuitEditor(this_00,circuit);
  local_48 = this_00;
  ModelCircuit::component_ids(&local_40,circuit);
  for (puVar1 = local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar1 != local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    component_model = ModelCircuit::component_by_id(circuit,*puVar1);
    CircuitEditor::create_widget_for_component(local_48,component_model);
    this_00 = local_48;
  }
  *(CircuitEditor **)this = this_00;
  local_48 = (CircuitEditor *)0x0;
  if ((local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start != (uint32_t *)0x0) &&
     (operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start),
     local_48 != (CircuitEditor *)0x0)) {
    std::default_delete<lsim::gui::CircuitEditor>::operator()
              ((default_delete<lsim::gui::CircuitEditor> *)&local_48,local_48);
  }
  return (__uniq_ptr_data<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>,_true,_true>
          )(__uniq_ptr_data<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>,_true,_true>
            )this;
}

Assistant:

CircuitEditor::uptr_t CircuitEditorFactory::create_circuit(ModelCircuit *circuit) {
	auto editor = std::make_unique<CircuitEditor>(circuit);

	auto comp_ids = circuit->component_ids();
    for (const auto &comp_id : comp_ids) {
		auto comp = circuit->component_by_id(comp_id);
		editor->create_widget_for_component(comp);
	}

    return std::move(editor);
}